

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O0

CURLcode ossl_set_provider(Curl_easy *data,char *iname)

{
  int iVar1;
  char *pcVar2;
  void *pvVar3;
  ulong error;
  char local_1c8 [8];
  char error_buffer [256];
  OSSL_LIB_CTX *libctx;
  char *propq;
  Curl_str prov;
  char name [129];
  char *iname_local;
  Curl_easy *data_local;
  
  libctx = (OSSL_LIB_CTX *)0x0;
  unique0x10000391 = (OSSL_LIB_CTX *)iname;
  if (iname == (char *)0x0) {
    ossl_provider_cleanup(data);
    data_local._4_4_ = CURLE_OK;
  }
  else {
    iVar1 = Curl_str_until((char **)(name + 0x80),(Curl_str *)&propq,0x80,':');
    if (iVar1 == 0) {
      iVar1 = Curl_str_single((char **)(name + 0x80),':');
      if (iVar1 == 0) {
        libctx = stack0xffffffffffffffe0;
      }
      memcpy(&prov.len,propq,(size_t)prov.str);
      *(char *)((long)&prov.len + (long)prov.str) = '\0';
      if ((data->state).libctx == (void *)0x0) {
        error_buffer._248_8_ = OSSL_LIB_CTX_new();
        if (error_buffer._248_8_ == 0) {
          return CURLE_OUT_OF_MEMORY;
        }
        if (libctx != (OSSL_LIB_CTX *)0x0) {
          pcVar2 = (*Curl_cstrdup)((char *)libctx);
          (data->state).propq = pcVar2;
          if ((data->state).propq == (char *)0x0) {
            OSSL_LIB_CTX_free(error_buffer._248_8_);
            return CURLE_OUT_OF_MEMORY;
          }
        }
        (data->state).libctx = (void *)error_buffer._248_8_;
      }
      iVar1 = OSSL_PROVIDER_available((data->state).libctx,&prov.len);
      if (iVar1 == 0) {
        pvVar3 = (void *)OSSL_PROVIDER_try_load((data->state).libctx,&prov.len,1);
        (data->state).provider = pvVar3;
        if ((data->state).provider == (void *)0x0) {
          error = ERR_get_error();
          pcVar2 = ossl_strerror(error,local_1c8,0x100);
          Curl_failf(data,"Failed to initialize provider: %s",pcVar2);
          ossl_provider_cleanup(data);
          data_local._4_4_ = CURLE_SSL_ENGINE_NOTFOUND;
        }
        else {
          pvVar3 = (void *)OSSL_PROVIDER_try_load((data->state).libctx,"base",1);
          (data->state).baseprov = pvVar3;
          if ((data->state).baseprov == (void *)0x0) {
            ossl_provider_cleanup(data);
            Curl_failf(data,"Failed to load base");
            data_local._4_4_ = CURLE_SSL_ENGINE_NOTFOUND;
          }
          else {
            (data->state).field_0x188 = (data->state).field_0x188 & 0xfe | 1;
            data_local._4_4_ = CURLE_OK;
          }
        }
      }
      else {
        (data->state).field_0x188 = (data->state).field_0x188 & 0xfe | 1;
        data_local._4_4_ = CURLE_OK;
      }
    }
    else {
      data_local._4_4_ = CURLE_BAD_FUNCTION_ARGUMENT;
    }
  }
  return data_local._4_4_;
}

Assistant:

static CURLcode ossl_set_provider(struct Curl_easy *data, const char *iname)
{
  char name[MAX_PROVIDER_LEN + 1];
  struct Curl_str prov;
  const char *propq = NULL;

  if(!iname) {
    /* clear and cleanup provider use */
    ossl_provider_cleanup(data);
    return CURLE_OK;
  }
  if(Curl_str_until(&iname, &prov, MAX_PROVIDER_LEN, ':'))
    return CURLE_BAD_FUNCTION_ARGUMENT;

  if(!Curl_str_single(&iname, ':'))
    /* there was a colon, get the propq until the end of string */
    propq = iname;

  /* we need the name in a buffer, null-terminated */
  memcpy(name, Curl_str(&prov), Curl_strlen(&prov));
  name[Curl_strlen(&prov)] = 0;

  if(!data->state.libctx) {
    OSSL_LIB_CTX *libctx = OSSL_LIB_CTX_new();
    if(!libctx)
      return CURLE_OUT_OF_MEMORY;
    if(propq) {
      data->state.propq = strdup(propq);
      if(!data->state.propq) {
        OSSL_LIB_CTX_free(libctx);
        return CURLE_OUT_OF_MEMORY;
      }
    }
    data->state.libctx = libctx;
  }

  if(OSSL_PROVIDER_available(data->state.libctx, name)) {
    /* already loaded through the configuration - no action needed */
    data->state.provider_loaded = TRUE;
    return CURLE_OK;
  }

  data->state.provider =
    OSSL_PROVIDER_try_load(data->state.libctx, name, 1);
  if(!data->state.provider) {
    char error_buffer[256];
    failf(data, "Failed to initialize provider: %s",
          ossl_strerror(ERR_get_error(), error_buffer,
                        sizeof(error_buffer)));
    ossl_provider_cleanup(data);
    return CURLE_SSL_ENGINE_NOTFOUND;
  }

  /* load the base provider as well */
  data->state.baseprov =
    OSSL_PROVIDER_try_load(data->state.libctx, "base", 1);
  if(!data->state.baseprov) {
    ossl_provider_cleanup(data);
    failf(data, "Failed to load base");
    return CURLE_SSL_ENGINE_NOTFOUND;
  }
  else
    data->state.provider_loaded = TRUE;
  return CURLE_OK;
}